

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::Emit2ArgsOP(SQCompiler *this,SQOpcode op,SQInteger p3)

{
  SQInteger arg0;
  SQInteger arg1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  SQInteger p1;
  SQInteger p2;
  SQFuncState *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SQOpcode _op;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  
  _op = (SQOpcode)((ulong)in_RDX >> 0x20);
  arg0 = SQFuncState::PopTarget
                   ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  arg1 = SQFuncState::PopTarget
                   ((SQFuncState *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  this_00 = *(SQFuncState **)(in_RDI + 8);
  uVar1 = in_ESI;
  SQFuncState::PushTarget(this_00,in_RDI);
  SQFuncState::AddInstruction
            ((SQFuncState *)CONCAT44(uVar1,in_stack_fffffffffffffff0),_op,arg0,arg1,
             CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(SQInteger)this_00);
  return;
}

Assistant:

void Emit2ArgsOP(SQOpcode op, SQInteger p3 = 0)
    {
        SQInteger p2 = _fs->PopTarget(); //src in OP_GET
        SQInteger p1 = _fs->PopTarget(); //key in OP_GET
        _fs->AddInstruction(op,_fs->PushTarget(), p1, p2, p3);
    }